

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O3

uint64_t __thiscall wave::File::Tell(File *this)

{
  _Head_base<0UL,_wave::File::Impl_*,_false> this_00;
  char cVar1;
  uint64_t uVar2;
  
  this_00._M_head_impl =
       (this->impl_)._M_t.
       super___uniq_ptr_impl<wave::File::Impl,_std::default_delete<wave::File::Impl>_>._M_t.
       super__Tuple_impl<0UL,_wave::File::Impl_*,_std::default_delete<wave::File::Impl>_>.
       super__Head_base<0UL,_wave::File::Impl_*,_false>._M_head_impl;
  cVar1 = std::__basic_file<char>::is_open();
  if ((cVar1 == '\0') && (cVar1 = std::__basic_file<char>::is_open(), cVar1 == '\0')) {
    return 0;
  }
  uVar2 = Impl::current_sample_index(this_00._M_head_impl);
  return uVar2 / *(uint16_t *)
                  ((long)&((this->impl_)._M_t.
                           super___uniq_ptr_impl<wave::File::Impl,_std::default_delete<wave::File::Impl>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_wave::File::Impl_*,_std::default_delete<wave::File::Impl>_>
                           .super__Head_base<0UL,_wave::File::Impl_*,_false>._M_head_impl)->header +
                  0x16);
}

Assistant:

uint64_t File::Tell() const {
  if (!impl_->ostream.is_open() && !impl_->istream.is_open()) {
    return 0;
  }

  auto sample_position = impl_->current_sample_index();
  return sample_position / channel_number();
}